

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::ProcessExtensions(void *user_data,spv_parsed_instruction_t *inst)

{
  bool bVar1;
  spv_parsed_instruction_t *in_RDX;
  spv_result_t sVar2;
  ValidationState_t *_;
  Extension extension;
  string extension_str;
  Extension local_3c;
  string local_38;
  
  sVar2 = SPV_SUCCESS;
  if (inst->opcode != 0x11) {
    if (inst->opcode == 10) {
      GetExtensionString_abi_cxx11_(&local_38,(spvtools *)inst,in_RDX);
      bVar1 = GetExtensionFromString(local_38._M_dataplus._M_p,&local_3c);
      if (bVar1) {
        ValidationState_t::RegisterExtension((ValidationState_t *)user_data,local_3c);
      }
      sVar2 = SPV_SUCCESS;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      sVar2 = SPV_REQUESTED_TERMINATION;
    }
  }
  return sVar2;
}

Assistant:

spv_result_t ProcessExtensions(void* user_data,
                               const spv_parsed_instruction_t* inst) {
  const spv::Op opcode = static_cast<spv::Op>(inst->opcode);
  if (opcode == spv::Op::OpCapability) return SPV_SUCCESS;

  if (opcode == spv::Op::OpExtension) {
    ValidationState_t& _ = *(reinterpret_cast<ValidationState_t*>(user_data));
    RegisterExtension(_, inst);
    return SPV_SUCCESS;
  }

  // OpExtension block is finished, requesting termination.
  return SPV_REQUESTED_TERMINATION;
}